

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::FormulasLoader::end__ci(FormulasLoader *this)

{
  VariableExpression *this_00;
  _Elt_pointer pvVar1;
  VariableExpression *local_18;
  
  this_00 = (VariableExpression *)operator_new(0x30);
  MathML::AST::VariableExpression::VariableExpression(this_00,&this->mCurrentTextData);
  (this->mCurrentTextData)._M_string_length = 0;
  *(this->mCurrentTextData)._M_dataplus._M_p = '\0';
  pvVar1 = (this->mNodeListStack).c.
           super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar1 == (this->mNodeListStack).c.
                super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pvVar1 = (this->mNodeListStack).c.
             super__Deque_base<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  local_18 = this_00;
  std::vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>>::
  emplace_back<MathML::AST::INode*>
            ((vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>> *)(pvVar1 + -1),
             (INode **)&local_18);
  return true;
}

Assistant:

bool FormulasLoader::end__ci()
	{
		MathML::AST::VariableExpression* variable = FW_NEW MathML::AST::VariableExpression( mCurrentTextData );
		mCurrentTextData.clear();
		mNodeListStack.top().push_back( variable );

		return true;
	}